

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MmlCompiler.h
# Opt level: O0

int __thiscall
rlib::sequencer::MmlCompiler::EventPitchBend::clone
          (EventPitchBend *this,__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  shared_ptr<rlib::sequencer::MmlCompiler::EventPitchBend> *in_stack_ffffffffffffffc8;
  EventPitchBend *this_00;
  
  this_00 = this;
  std::
  make_shared<rlib::sequencer::MmlCompiler::EventPitchBend,rlib::sequencer::MmlCompiler::EventPitchBend_const&>
            (this);
  std::shared_ptr<rlib::sequencer::MmlCompiler::Event>::
  shared_ptr<rlib::sequencer::MmlCompiler::EventPitchBend,void>
            ((shared_ptr<rlib::sequencer::MmlCompiler::Event> *)this_00,in_stack_ffffffffffffffc8);
  std::shared_ptr<rlib::sequencer::MmlCompiler::EventPitchBend>::~shared_ptr
            ((shared_ptr<rlib::sequencer::MmlCompiler::EventPitchBend> *)0x17d4c3);
  return (int)this;
}

Assistant:

virtual std::shared_ptr<Event> clone()const {
				return std::make_shared<EventPitchBend>(*this);
			}